

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::RemoveSpecialShaderAttributes
          (ConversionStream *this)

{
  TokenListType *this_00;
  _List_node_base *p_Var1;
  uint uVar2;
  int iVar3;
  HLSL2GLSLConverterImpl *pHVar4;
  bool bVar5;
  iterator __first;
  const_iterator cVar6;
  iterator iVar7;
  uint uVar8;
  uint uVar9;
  char (*Args_1) [32];
  uint uVar10;
  iterator ScopeStartToken;
  string err;
  String local_50;
  
  ScopeStartToken._M_node =
       (this->m_Tokens).
       super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  uVar2 = *(uint *)&ScopeStartToken._M_node[1]._M_next;
  if (uVar2 == 0x133) {
    ScopeStartToken._M_node = (ScopeStartToken._M_node)->_M_next;
  }
  uVar8 = (uint)(uVar2 == 0x133);
  this_00 = &this->m_Tokens;
  uVar10 = uVar8;
LAB_002a452b:
  do {
    __first._M_node = ScopeStartToken._M_node;
    iVar7._M_node = (_List_node_base *)this_00;
    uVar9 = uVar10;
    if (ScopeStartToken._M_node == (_List_node_base *)this_00) {
LAB_002a4631:
      Args_1 = (char (*) [32])(ulong)uVar2;
      if (uVar2 == 0x133) {
        if (iVar7._M_node == (_List_node_base *)this_00) {
          FormatString<char[38]>(&err,(char (*) [38])"Unexpected EOF while processing scope");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_50,this,&ScopeStartToken,4);
          Args_1 = (char (*) [32])0xd1e;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessScope",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0xd1e,&err,(char (*) [2])0x5ddb85,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&err);
        }
        if (*(int *)&ScopeStartToken._M_node[1]._M_next == 0x134) {
          return;
        }
        FormatString<char[26],char[32]>
                  (&err,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Token->Type == ClosingParenType",Args_1);
        DebugAssertionFailed
                  (err._M_dataplus._M_p,"ProcessScope",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xd1f);
      }
      else {
        if (uVar9 == 0) {
          return;
        }
        FormatString<char[20]>(&err,(char (*) [20])"Unbalanced brackets");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_50,this,&ScopeStartToken,4);
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessScope",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xd23,&err,(char (*) [2])0x5ddb85,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::~string((string *)&err);
      return;
    }
    iVar3 = *(int *)&ScopeStartToken._M_node[1]._M_next;
    if (iVar3 == 0x134) {
      uVar9 = uVar10 - 1;
      bVar5 = (int)uVar10 <= (int)uVar8;
      iVar7._M_node = ScopeStartToken._M_node;
      uVar10 = uVar9;
      if (bVar5) goto LAB_002a4631;
    }
    else if (iVar3 == 0x133) {
      uVar10 = uVar10 + 1;
    }
    iVar7._M_node = (ScopeStartToken._M_node)->_M_next;
    ScopeStartToken._M_node = iVar7._M_node;
    if (iVar7._M_node != (_List_node_base *)this_00 && (iVar3 == 0x137 && uVar10 == 0)) {
      pHVar4 = this->m_Converter;
      HashMapStringKey::HashMapStringKey
                ((HashMapStringKey *)&err,(Char *)iVar7._M_node[1]._M_prev,false);
      cVar6 = std::
              _Hashtable<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(pHVar4->m_SpecialShaderAttributes)._M_h,(key_type *)&err);
      HashMapStringKey::Clear((HashMapStringKey *)&err);
      if (cVar6.super__Node_iterator_base<Diligent::HashMapStringKey,_false>._M_cur ==
          (__node_type *)0x0) {
        ScopeStartToken._M_node = (iVar7._M_node)->_M_next;
      }
      else {
        do {
          ScopeStartToken._M_node = iVar7._M_node;
          if (iVar7._M_node == (_List_node_base *)this_00) goto LAB_002a452b;
          p_Var1 = iVar7._M_node + 1;
          iVar7._M_node = (iVar7._M_node)->_M_next;
        } while (*(int *)&p_Var1->_M_next != 0x138);
        ScopeStartToken._M_node = iVar7._M_node;
        if (iVar7._M_node != (_List_node_base *)this_00) {
          std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__first._M_node[3]._M_prev,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &iVar7._M_node[3]._M_prev);
          iVar7._M_node = ScopeStartToken._M_node;
          std::__cxx11::string::operator=
                    ((string *)&ScopeStartToken._M_node[3]._M_prev,(string *)&err);
          std::__cxx11::string::~string((string *)&err);
        }
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        erase(this_00,(const_iterator)__first._M_node,(const_iterator)iVar7._M_node);
      }
    }
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::RemoveSpecialShaderAttributes()
{
    auto ScopeStartToken = m_Tokens.begin();
    ProcessScope(
        ScopeStartToken, m_Tokens.end(), TokenType::OpenBrace, TokenType::ClosingBrace,
        [&](TokenListType::iterator& Token, int ScopeDepth) //
        {
            // Search global scope only
            if (ScopeDepth != 0 || Token->Type != TokenType::OpenSquareBracket)
            {
                ++Token;
                return;
            }

            // [numthreads(16, 16, 1)]
            // ^
            auto OpenStaple = Token;
            ++Token;
            if (Token == m_Tokens.end())
                return;
            // [numthreads(16, 16, 1)]
            //  ^
            if (m_Converter.m_SpecialShaderAttributes.find(Token->Literal.c_str()) != m_Converter.m_SpecialShaderAttributes.end())
            {
                while (Token != m_Tokens.end() && Token->Type != TokenType::ClosingSquareBracket)
                    ++Token;
                // [numthreads(16, 16, 1)]
                //                       ^
                if (Token == m_Tokens.end())
                    return;
                ++Token;
                // [numthreads(16, 16, 1)]
                // void CS(uint3 ThreadId  : SV_DispatchThreadID)
                // ^
                if (Token != m_Tokens.end())
                    Token->Delimiter = OpenStaple->Delimiter + Token->Delimiter;
                m_Tokens.erase(OpenStaple, Token);
            }
            else
                ++Token;
        } //
    );
}